

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

int ixmlNode_setPrefix(IXML_Node_conflict *nodeptr,char *prefix)

{
  char *pcVar1;
  char *prefix_local;
  IXML_Node_conflict *nodeptr_local;
  
  if (nodeptr == (IXML_Node_conflict *)0x0) {
    nodeptr_local._4_4_ = 0x69;
  }
  else {
    if (nodeptr->prefix != (char *)0x0) {
      free(nodeptr->prefix);
      nodeptr->prefix = (char *)0x0;
    }
    if (prefix != (char *)0x0) {
      pcVar1 = strdup(prefix);
      nodeptr->prefix = pcVar1;
      if (nodeptr->prefix == (char *)0x0) {
        return 0x66;
      }
    }
    nodeptr_local._4_4_ = 0;
  }
  return nodeptr_local._4_4_;
}

Assistant:

static int ixmlNode_setPrefix(
	/*! [in] The \b Node on which to operate. */
	IXML_Node *nodeptr,
	/*! [in] The prefix string to set. */
	const char *prefix)
{
	if (nodeptr == NULL) {
		return IXML_INVALID_PARAMETER;
	}

	if (nodeptr->prefix != NULL) {
		free(nodeptr->prefix);
		nodeptr->prefix = NULL;
	}

	if (prefix != NULL) {
		nodeptr->prefix = strdup(prefix);
		if (nodeptr->prefix == NULL) {
			return IXML_INSUFFICIENT_MEMORY;
		}
	}

	return IXML_SUCCESS;
}